

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::VertexArrayTest::VertexArrayTest
          (VertexArrayTest *this,TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc
          )

{
  int iVar1;
  deInt32 dVar2;
  undefined4 extraout_var;
  PixelFormat *pPVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *desc_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  VertexArrayTest *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__VertexArrayTest_00cbb5f8;
  this->m_renderCtx = renderCtx;
  this->m_refBuffers = (ReferenceContextBuffers *)0x0;
  this->m_refContext = (ReferenceContext *)0x0;
  this->m_glesContext = (Context *)0x0;
  this->m_glArrayPack = (ContextArrayPack *)0x0;
  this->m_rrArrayPack = (ContextArrayPack *)0x0;
  this->m_isOk = false;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar3 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar1));
  dVar2 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)pPVar3->redBits & 0x1f))) * 256.0);
  this->m_maxDiffRed = dVar2;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar3 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_00,iVar1));
  dVar2 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)pPVar3->greenBits & 0x1f))) * 256.0);
  this->m_maxDiffGreen = dVar2;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar3 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar1));
  dVar2 = deCeilFloatToInt32((2.0 / (float)(1 << ((byte)pPVar3->blueBits & 0x1f))) * 256.0);
  this->m_maxDiffBlue = dVar2;
  return;
}

Assistant:

VertexArrayTest::VertexArrayTest (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name ,const char* desc)
	: TestCase			(testCtx, name, desc)
	, m_renderCtx		(renderCtx)
	, m_refBuffers		(DE_NULL)
	, m_refContext		(DE_NULL)
	, m_glesContext		(DE_NULL)
	, m_glArrayPack		(DE_NULL)
	, m_rrArrayPack		(DE_NULL)
	, m_isOk			(false)
	, m_maxDiffRed		(deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().redBits))))
	, m_maxDiffGreen	(deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().greenBits))))
	, m_maxDiffBlue		(deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().blueBits))))
{
}